

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream_suite.cpp
# Opt level: O0

void ostringstream_suite::test_empty(void)

{
  basic_ostream<char,_std::char_traits<char>_> **this;
  string local_1c0 [48];
  undefined1 local_190 [8];
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  container;
  ostringstream output;
  
  this = &container.
          super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>.
          content;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  ::ostream_buffer((ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
                    *)local_190,(basic_ostream<char,_std::char_traits<char>_> *)this);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[1]>
            ("output.str()","\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/buffer/ostream_suite.cpp"
             ,0x3c,"void ostringstream_suite::test_empty()",local_1c0,"");
  std::__cxx11::string::~string(local_1c0);
  ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
  ::~ostream_buffer((ostream_buffer<char,_trial::protocol::buffer::basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>_>
                     *)local_190);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &container.
              super_basic_ostream<char,_std::char_traits<char>,_trial::protocol::buffer::base<char>_>
              .content);
  return;
}

Assistant:

void test_empty()
{
    std::ostringstream output;
    ostream_buffer<char> container(output);

    TRIAL_PROTOCOL_TEST_EQUAL(output.str(), "");
}